

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O0

int s2pred::TriageCompareSin2Distance<long_double>
              (Vector3<long_double> *x,Vector3<long_double> *y,longdouble r2)

{
  ostream *poVar1;
  longdouble *in_RCX;
  longdouble in_ST0;
  int local_e4;
  longdouble error;
  longdouble diff;
  longdouble sin2_r_error;
  longdouble sin2_r;
  longdouble sin2_xy;
  longdouble sin2_xy_error;
  longdouble T_ERR;
  byte local_41;
  S2LogMessage local_40;
  S2LogMessageVoidify local_29;
  undefined1 auStack_28 [8];
  longdouble r2_local;
  Vector3<long_double> *y_local;
  Vector3<long_double> *x_local;
  
  _auStack_28 = r2;
  local_41 = 0;
  unique0x100000cf = y;
  y_local = x;
  if ((longdouble)2.0 <= r2) {
    in_RCX = (longdouble *)0x3;
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.cc"
               ,0x1e8,kFatal,(ostream *)&std::cerr);
    local_41 = 1;
    poVar1 = S2LogMessage::stream(&local_40);
    poVar1 = std::operator<<(poVar1,"Check failed: (r2) < (2.0) ");
    S2LogMessageVoidify::operator&(&local_29,poVar1);
  }
  if ((local_41 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_40);
  }
  register0x00001100 = (longdouble)5.421011e-20;
  GetSin2Distance((longdouble *)y_local,stack0xffffffffffffffe8,(Vector3_ld *)((long)&sin2_xy + 8),
                  in_RCX);
  _auStack_28 = ((longdouble)1 + (longdouble)-0.25 * _auStack_28) * _auStack_28;
  in_ST0 = in_ST0 - _auStack_28;
  register0x00001110 = (longdouble)1.6263033e-19 * _auStack_28 + stack0xffffffffffffff88;
  if (in_ST0 <= register0x00001110) {
    local_e4 = -(uint)(in_ST0 < -register0x00001110);
  }
  else {
    local_e4 = 1;
  }
  return local_e4;
}

Assistant:

int TriageCompareSin2Distance(const Vector3<T>& x, const Vector3<T>& y, T r2) {
  S2_DCHECK_LT(r2, 2.0);  // Only valid for distance limits < 90 degrees.

  constexpr T T_ERR = rounding_epsilon<T>();
  T sin2_xy_error;
  T sin2_xy = GetSin2Distance(x, y, &sin2_xy_error);
  T sin2_r = r2 * (1 - 0.25 * r2);
  T sin2_r_error = 3 * T_ERR * sin2_r;
  T diff = sin2_xy - sin2_r;
  T error = sin2_xy_error + sin2_r_error;
  return (diff > error) ? 1 : (diff < -error) ? -1 : 0;
}